

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManager::setCache(QNetworkAccessManager *this,QAbstractNetworkCache *cache)

{
  QNetworkAccessManagerPrivate *pQVar1;
  QAbstractNetworkCache *in_RSI;
  QNetworkAccessManagerPrivate *d;
  
  pQVar1 = d_func((QNetworkAccessManager *)0x19b691);
  if (pQVar1->networkCache != in_RSI) {
    if (pQVar1->networkCache != (QAbstractNetworkCache *)0x0) {
      (**(code **)(*(long *)pQVar1->networkCache + 0x20))();
    }
    pQVar1->networkCache = in_RSI;
    if (pQVar1->networkCache != (QAbstractNetworkCache *)0x0) {
      QObject::setParent(&pQVar1->networkCache->super_QObject);
    }
  }
  return;
}

Assistant:

void QNetworkAccessManager::setCache(QAbstractNetworkCache *cache)
{
    Q_D(QNetworkAccessManager);
    if (d->networkCache != cache) {
        delete d->networkCache;
        d->networkCache = cache;
        if (d->networkCache)
            d->networkCache->setParent(this);
    }
}